

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O1

float __thiscall MetaCommand::GetValueAsFloat(MetaCommand *this,Option *option,string *fieldName)

{
  pointer pcVar1;
  pointer pFVar2;
  size_t __n;
  undefined1 *__s2;
  int iVar3;
  pointer pFVar4;
  double dVar5;
  string fieldname;
  float local_4c;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  pcVar1 = (fieldName->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + fieldName->_M_string_length);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_48);
  }
  __s2 = local_48;
  pFVar4 = (option->fields).
           super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (option->fields).
           super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_4c = 0.0;
  do {
    if (pFVar4 == pFVar2) {
LAB_0011a19c:
      if (local_48 != local_38) {
        operator_delete(local_48);
      }
      return local_4c;
    }
    __n = (pFVar4->name)._M_string_length;
    if ((__n == local_40) &&
       ((__n == 0 || (iVar3 = bcmp((pFVar4->name)._M_dataplus._M_p,__s2,__n), iVar3 == 0)))) {
      dVar5 = atof((pFVar4->value)._M_dataplus._M_p);
      local_4c = (float)dVar5;
      goto LAB_0011a19c;
    }
    pFVar4 = pFVar4 + 1;
  } while( true );
}

Assistant:

float MetaCommand::GetValueAsFloat(Option option,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = option.name;
  }

  METAIO_STL::vector<Field>::const_iterator itField = option.fields.begin();
  while(itField != option.fields.end())
    {
    if((*itField).name == fieldname)
      {
      return (float)atof((*itField).value.c_str());
      }
    ++itField;
    }
  return 0;
}